

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_19cdc37::ResizeRealtimeTest_TestExternalResizeWorksUsePSNR_Test::TestBody
          (ResizeRealtimeTest_TestExternalResizeWorksUsePSNR_Test *this)

{
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  pointer pFVar5;
  SEARCH_METHODS *pSVar6;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  AssertHelper local_b8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  uint expected_h;
  EncoderTest *local_88;
  pointer local_80;
  uint expected_w;
  ResizingVideoSource video;
  
  ResizingVideoSource::ResizingVideoSource(&video,0x140,0xf0);
  video.super_DummyVideoSource._44_4_ = 1;
  (this->super_ResizeRealtimeTest).change_bitrate_ = false;
  local_88 = &(this->super_ResizeRealtimeTest).super_EncoderTest;
  (this->super_ResizeRealtimeTest).mismatch_psnr_ = 0.0;
  *(undefined8 *)((long)&(this->super_ResizeRealtimeTest).mismatch_psnr_ + 7) = 0;
  (this->super_ResizeRealtimeTest).super_EncoderTest.init_flags_ = 0x10000;
  (this->super_ResizeRealtimeTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0x1e;
  ResizeRealtimeTest::DefaultConfig(&this->super_ResizeRealtimeTest);
  bVar4 = true;
  bVar3 = false;
  do {
    video.change_start_resln_ = bVar3;
    bVar3 = testing::internal::AlwaysTrue();
    if (!bVar3) {
LAB_0066f9cb:
      testing::Message::Message((Message *)&gtest_fatal_failure_checker);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                 ,0x34a,
                 "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_c0,(Message *)&gtest_fatal_failure_checker);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
      if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                           _vptr_TestPartResultReporterInterface._1_7_,
                           (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                                 _vptr_TestPartResultReporterInterface) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.
                                       super_TestPartResultReporterInterface.
                                       _vptr_TestPartResultReporterInterface._1_7_,
                                       (char)gtest_fatal_failure_checker.
                                             super_TestPartResultReporterInterface.
                                             _vptr_TestPartResultReporterInterface) + 8))();
      }
      goto LAB_0066fab0;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      (*local_88->_vptr_EncoderTest[2])(local_88,&video);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 != false) goto LAB_0066f9cb;
    local_c0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)(this->super_ResizeRealtimeTest).frame_info_list_.
                super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super_ResizeRealtimeTest).frame_info_list_.
                super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4);
    local_b8.data_._0_4_ = video.super_DummyVideoSource.limit_;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)&gtest_fatal_failure_checker,"frame_info_list_.size()","video.limit()",
               (unsigned_long *)&local_c0,(uint *)&local_b8);
    if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
              _vptr_TestPartResultReporterInterface == '\0') {
      testing::Message::Message((Message *)&local_c0);
      if ((undefined8 *)
          CONCAT71(gtest_fatal_failure_checker._9_7_,
                   gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
        pSVar6 = "";
      }
      else {
        pSVar6 = *(SEARCH_METHODS **)
                  CONCAT71(gtest_fatal_failure_checker._9_7_,
                           gtest_fatal_failure_checker.has_new_fatal_failure_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                 ,0x34d,(char *)pSVar6);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c0._M_head_impl + 8))();
      }
      puVar1 = (undefined8 *)
               CONCAT71(gtest_fatal_failure_checker._9_7_,
                        gtest_fatal_failure_checker.has_new_fatal_failure_);
      if (puVar1 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar1 != puVar1 + 2) {
          operator_delete((undefined8 *)*puVar1);
        }
        operator_delete(puVar1);
      }
      goto LAB_0066fab0;
    }
    puVar1 = (undefined8 *)
             CONCAT71(gtest_fatal_failure_checker._9_7_,
                      gtest_fatal_failure_checker.has_new_fatal_failure_);
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    pFVar5 = (this->super_ResizeRealtimeTest).frame_info_list_.
             super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80 = (this->super_ResizeRealtimeTest).frame_info_list_.
               super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar5 != local_80) {
      do {
        ScaleForFrameNumber((uint)pFVar5->pts,0x140,0xf0,video.super_DummyVideoSource._44_4_,
                            video.change_start_resln_,false,&expected_w,&expected_h);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&gtest_fatal_failure_checker,"expected_w","info.w",&expected_w,
                   &pFVar5->w);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_c0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_c0._M_head_impl + 0x10),"Frame ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_c0._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_c0._M_head_impl + 0x10)," had unexpected width",0x15);
          pSVar6 = "";
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0) {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                     ,0x355,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_b8);
          if (local_c0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c0._M_head_impl + 8))();
          }
        }
        puVar1 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar1 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar1 != puVar1 + 2) {
            operator_delete((undefined8 *)*puVar1);
          }
          operator_delete(puVar1);
        }
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&gtest_fatal_failure_checker,"expected_h","info.h",&expected_h,
                   &pFVar5->h);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_c0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_c0._M_head_impl + 0x10),"Frame ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_c0._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_c0._M_head_impl + 0x10)," had unexpected height",0x16);
          pSVar6 = "";
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0) {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                     ,0x357,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_b8);
          if (local_c0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c0._M_head_impl + 8))();
          }
        }
        puVar1 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar1 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar1 != puVar1 + 2) {
            operator_delete((undefined8 *)*puVar1);
          }
          operator_delete(puVar1);
        }
        local_c0._M_head_impl = local_c0._M_head_impl & 0xffffffff00000000;
        local_b8.data_._0_4_ = (this->super_ResizeRealtimeTest).mismatch_nframes_;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&gtest_fatal_failure_checker,"static_cast<unsigned int>(0)",
                   "GetMismatchFrames()",(uint *)&local_c0,(uint *)&local_b8);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_c0);
          pSVar6 = "";
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0) {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                     ,0x359,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_b8);
          if (local_c0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c0._M_head_impl + 8))();
          }
        }
        puVar1 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar1 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar1 != puVar1 + 2) {
            operator_delete((undefined8 *)*puVar1);
          }
          operator_delete(puVar1);
        }
        pFVar5 = pFVar5 + 1;
      } while (pFVar5 != local_80);
      pFVar5 = (this->super_ResizeRealtimeTest).frame_info_list_.
               super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->super_ResizeRealtimeTest).frame_info_list_.
          super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish != pFVar5) {
        (this->super_ResizeRealtimeTest).frame_info_list_.
        super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pFVar5;
      }
    }
    bVar2 = !bVar4;
    bVar4 = false;
    bVar3 = true;
    if (bVar2) {
LAB_0066fab0:
      video.super_DummyVideoSource.super_VideoSource._vptr_VideoSource =
           (_func_int **)&PTR__DummyVideoSource_010306b0;
      aom_img_free(video.super_DummyVideoSource.img_);
      return;
    }
  } while( true );
}

Assistant:

TEST_P(ResizeRealtimeTest, TestExternalResizeWorksUsePSNR) {
  ResizingVideoSource video(kInitialWidth, kInitialHeight);
  video.flag_codec_ = 1;
  change_bitrate_ = false;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = false;
  mismatch_psnr_ = 0.0;
  mismatch_nframes_ = 0;
  init_flags_ = AOM_CODEC_USE_PSNR;
  cfg_.rc_dropframe_thresh = 30;
  DefaultConfig();
  // Test external resizing with start resolution equal to
  // 1. kInitialWidth and kInitialHeight
  // 2. down-scaled kInitialWidth and kInitialHeight
  for (int i = 0; i < 2; i++) {
    video.change_start_resln_ = static_cast<bool>(i);

    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
#if CONFIG_AV1_DECODER
    // Check we decoded the same number of frames as we attempted to encode
    ASSERT_EQ(frame_info_list_.size(), video.limit());
    for (const auto &info : frame_info_list_) {
      const unsigned int frame = static_cast<unsigned>(info.pts);
      unsigned int expected_w;
      unsigned int expected_h;
      ScaleForFrameNumber(frame, kInitialWidth, kInitialHeight,
                          video.flag_codec_, video.change_start_resln_, false,
                          &expected_w, &expected_h);
      EXPECT_EQ(expected_w, info.w)
          << "Frame " << frame << " had unexpected width";
      EXPECT_EQ(expected_h, info.h)
          << "Frame " << frame << " had unexpected height";
      EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
    }
#else
    printf("Warning: AV1 decoder unavailable, unable to check resize count!\n");
#endif
    frame_info_list_.clear();
  }
}